

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_column_reader.hpp
# Opt level: O0

bool duckdb::BooleanParquetValueConversion::PlainRead<true>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  uint8_t uVar1;
  BooleanColumnReader *pBVar2;
  uint8_t *puVar3;
  undefined8 *in_RDI;
  byte bVar4;
  bool ret;
  uint8_t *byte_pos;
  uint64_t in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  pBVar2 = ColumnReader::Cast<duckdb::BooleanColumnReader>((ColumnReader *)plain_data);
  puVar3 = &pBVar2->byte_pos;
  bVar4 = ((int)(uint)*(byte *)*in_RDI >> (*puVar3 & 0x1f) & 1U) != 0;
  uVar1 = *puVar3;
  *puVar3 = uVar1 + '\x01';
  if ((uint8_t)(uVar1 + '\x01') == '\b') {
    *puVar3 = '\0';
    ByteBuffer::inc((ByteBuffer *)CONCAT17(bVar4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8);
  }
  return (bool)(bVar4 & 1);
}

Assistant:

static bool PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &byte_pos = reader.Cast<BooleanColumnReader>().byte_pos;
		bool ret = (*plain_data.ptr >> byte_pos) & 1;
		if (++byte_pos == 8) {
			byte_pos = 0;
			if (CHECKED) {
				plain_data.inc(1);
			} else {
				plain_data.unsafe_inc(1);
			}
		}
		return ret;
	}